

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O2

InputMap * Omega_h::read_input(InputMap *__return_storage_ptr__,path *path)

{
  bool bVar1;
  ScopedTimer omega_h_scoped_function_timer;
  ScopedTimer local_92;
  allocator local_91;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_input.cpp"
             ,&local_91);
  std::operator+(&local_50,&local_70,":");
  std::__cxx11::to_string(&local_90,0x39c);
  std::operator+(&local_30,&local_50,&local_90);
  begin_code("read_input",local_30._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  read_input_without_includes(__return_storage_ptr__,path);
  do {
    bVar1 = handle_one_include(__return_storage_ptr__);
  } while (bVar1);
  ScopedTimer::~ScopedTimer(&local_92);
  return __return_storage_ptr__;
}

Assistant:

InputMap read_input(Omega_h::filesystem::path const& path) {
  OMEGA_H_TIME_FUNCTION;
  InputMap map = read_input_without_includes(path);
  while (handle_one_include(map))
    ;
  return map;
}